

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber checkDataSame(TA_Real *data,TA_Real *originalInput,uint nbElement)

{
  double *pdVar1;
  uint in_EDX;
  TA_Real *in_RSI;
  long in_RDI;
  ErrorNumber errNb;
  uint i;
  uint local_20;
  ErrorNumber local_4;
  
  local_4 = checkForNAN(in_RSI,in_EDX);
  if (local_4 == TA_TEST_PASS) {
    if (in_EDX < 0x119) {
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
        pdVar1 = (double *)(in_RDI + (ulong)local_20 * 8);
        if ((in_RSI[local_20] != *pdVar1) || (NAN(in_RSI[local_20]) || NAN(*pdVar1))) {
          printf("Fail: Data was wrongly modified (%f,%f,%d)\n",in_RSI[local_20],
                 *(undefined8 *)(in_RDI + (ulong)local_20 * 8),(ulong)local_20);
          return TA_TEST_TFRR_INPUT_HAS_BEEN_MODIFIED;
        }
      }
      local_4 = TA_TEST_PASS;
    }
    else {
      printf("Fail: outNbElement is out of range 1 (%d)\n",(ulong)in_EDX);
      local_4 = TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
    }
  }
  return local_4;
}

Assistant:

ErrorNumber checkDataSame( const TA_Real *data,
                           const TA_Real *originalInput,
                           unsigned int nbElement )
{
   unsigned int i;
   ErrorNumber errNb;

   errNb = checkForNAN( data, nbElement );

   if( errNb != TA_TEST_PASS )
       return errNb;

   if( nbElement > MAX_NB_TEST_ELEMENT )
   {
       printf( "Fail: outNbElement is out of range 1 (%d)\n", nbElement );
       return TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
   }

   for( i=0; i < nbElement; i++ )
   {
      if( originalInput[i] != data[i] )
      {
         printf( "Fail: Data was wrongly modified (%f,%f,%d)\n",
                 originalInput[i],
                 data[i], i );
         return TA_TEST_TFRR_INPUT_HAS_BEEN_MODIFIED;
      }
   }

   return TA_TEST_PASS;
}